

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O2

void lm_trie_fill_raw_ngram
               (lm_trie_t *trie,ngram_raw_t *raw_ngrams,uint32 *raw_ngram_idx,uint32 *counts,
               node_range_t range,uint32 *hist,int n_hist,int order,int max_order)

{
  middle_t *pmVar1;
  uint8 *puVar2;
  longest_t *plVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 *puVar6;
  uint uVar7;
  uint32 *puVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  node_range_t range_00;
  node_range_t range_01;
  ngram_raw_t *pnVar12;
  uint32 i;
  int iVar13;
  ulong uVar14;
  int iVar15;
  float32 fVar16;
  float fVar17;
  bitarr_address_t address;
  bitarr_address_t address_00;
  bitarr_address_t address_01;
  bitarr_address_t address_02;
  bitarr_address_t address_03;
  bitarr_address_t address_04;
  bitarr_address_t address_05;
  bitarr_address_t address_06;
  
  uVar7 = range.end;
  if (n_hist < 1 || range.begin != uVar7) {
    if (n_hist == 0) {
      lVar9 = 0x14;
      for (uVar14 = 0; uVar14 < *counts; uVar14 = uVar14 + 1) {
        uVar4 = *(uint32 *)((long)&trie->unigrams[-1].prob + lVar9);
        uVar5 = *(uint32 *)((long)&trie->unigrams->prob + lVar9);
        *hist = (uint32)uVar14;
        range_01.end = uVar5;
        range_01.begin = uVar4;
        lm_trie_fill_raw_ngram(trie,raw_ngrams,raw_ngram_idx,counts,range_01,hist,1,order,max_order)
        ;
        lVar9 = lVar9 + 0xc;
      }
    }
    else if (n_hist < order + -1) {
      lVar9 = (long)n_hist;
      pmVar1 = trie->middle_begin;
      while (uVar11 = range.begin, uVar11 < uVar7) {
        puVar2 = pmVar1[lVar9 + -1].base.base;
        iVar13 = pmVar1[lVar9 + -1].base.total_bits * uVar11;
        address.offset = iVar13;
        address.base = puVar2;
        address._12_4_ = 0;
        uVar4 = bitarr_read_int25(address,pmVar1[lVar9 + -1].base.word_bits,
                                  pmVar1[lVar9 + -1].base.word_mask);
        hist[lVar9] = uVar4;
        address_00.offset =
             (uint)pmVar1[lVar9 + -1].quant_bits + (uint)pmVar1[lVar9 + -1].base.word_bits + iVar13;
        address_00.base = puVar2;
        address_00._12_4_ = 0;
        uVar4 = bitarr_read_int25(address_00,pmVar1[lVar9 + -1].next_mask.bits,
                                  pmVar1[lVar9 + -1].next_mask.mask);
        range.begin = uVar11 + 1;
        range.end = 0;
        address_01.offset =
             (uint)pmVar1[lVar9 + -1].quant_bits + (uint)pmVar1[lVar9 + -1].base.word_bits +
             pmVar1[lVar9 + -1].base.total_bits * range.begin;
        address_01.base = puVar2;
        address_01._12_4_ = 0;
        uVar5 = bitarr_read_int25(address_01,pmVar1[lVar9 + -1].next_mask.bits,
                                  pmVar1[lVar9 + -1].next_mask.mask);
        range_00.end = uVar5;
        range_00.begin = uVar4;
        lm_trie_fill_raw_ngram
                  (trie,raw_ngrams,raw_ngram_idx,counts,range_00,hist,n_hist + 1,order,max_order);
      }
    }
    else {
      if (order + -1 != n_hist) {
        __assert_fail("n_hist == order - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                      ,0x36e,
                      "void lm_trie_fill_raw_ngram(lm_trie_t *, ngram_raw_t *, uint32 *, uint32 *, node_range_t, uint32 *, int, int, int)"
                     );
      }
      iVar13 = n_hist + -1;
      lVar9 = (long)n_hist;
      while (uVar11 = range.begin, uVar11 < uVar7) {
        pnVar12 = raw_ngrams + *raw_ngram_idx;
        if (order == max_order) {
          plVar3 = trie->longest;
          puVar2 = (plVar3->base).base;
          iVar15 = (plVar3->base).total_bits * uVar11;
          address_02.offset = iVar15;
          address_02.base = puVar2;
          address_02._12_4_ = 0;
          uVar4 = bitarr_read_int25(address_02,(plVar3->base).word_bits,(plVar3->base).word_mask);
          hist[lVar9] = uVar4;
          address_04.offset = (uint)(plVar3->base).word_bits + iVar15;
          address_04.base = puVar2;
          address_04._12_4_ = 0;
          fVar16 = (float32)lm_trie_quant_lpread(trie->quant,address_04);
        }
        else {
          pmVar1 = trie->middle_begin;
          puVar2 = pmVar1[iVar13].base.base;
          iVar15 = pmVar1[iVar13].base.total_bits * uVar11;
          address_03.offset = iVar15;
          address_03.base = puVar2;
          address_03._12_4_ = 0;
          uVar4 = bitarr_read_int25(address_03,pmVar1[iVar13].base.word_bits,
                                    pmVar1[iVar13].base.word_mask);
          hist[lVar9] = uVar4;
          iVar15 = (uint)pmVar1[iVar13].base.word_bits + iVar15;
          address_05.offset = iVar15;
          address_05.base = puVar2;
          address_05._12_4_ = 0;
          fVar16 = (float32)lm_trie_quant_mpread(trie->quant,address_05,iVar13);
          address_06.offset = iVar15;
          address_06.base = puVar2;
          address_06._12_4_ = 0;
          fVar17 = lm_trie_quant_mboread(trie->quant,address_06,iVar13);
          pnVar12->backoff = (float32)fVar17;
        }
        pnVar12->prob = fVar16;
        puVar6 = (uint32 *)
                 __ckd_calloc__((long)order,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                ,0x38c);
        pnVar12->words = puVar6;
        puVar8 = hist + lVar9;
        for (lVar10 = 0; lVar10 <= lVar9; lVar10 = lVar10 + 1) {
          puVar6[lVar10] = *puVar8;
          puVar8 = puVar8 + -1;
        }
        *raw_ngram_idx = *raw_ngram_idx + 1;
        range.begin = uVar11 + 1;
        range.end = 0;
      }
    }
  }
  return;
}

Assistant:

void
lm_trie_fill_raw_ngram(lm_trie_t * trie,
    		       ngram_raw_t * raw_ngrams, uint32 * raw_ngram_idx,
            	       uint32 * counts, node_range_t range, uint32 * hist,
    	               int n_hist, int order, int max_order)
{
    if (n_hist > 0 && range.begin == range.end) {
        return;
    }
    if (n_hist == 0) {
        uint32 i;
        for (i = 0; i < counts[0]; i++) {
            node_range_t node;
            unigram_find(trie->unigrams, i, &node);
            hist[0] = i;
            lm_trie_fill_raw_ngram(trie, raw_ngrams, raw_ngram_idx, counts,
                           node, hist, 1, order, max_order);
        }
    }
    else if (n_hist < order - 1) {
        uint32 ptr;
        node_range_t node;
        bitarr_address_t address;
        uint32 new_word;
        middle_t *middle = &trie->middle_begin[n_hist - 1];
        for (ptr = range.begin; ptr < range.end; ptr++) {
            address.base = middle->base.base;
            address.offset = ptr * middle->base.total_bits;
            new_word =
                bitarr_read_int25(address, middle->base.word_bits,
                                  middle->base.word_mask);
            hist[n_hist] = new_word;
            address.offset += middle->base.word_bits + middle->quant_bits;
            node.begin =
                bitarr_read_int25(address, middle->next_mask.bits,
                                  middle->next_mask.mask);
            address.offset =
                (ptr + 1) * middle->base.total_bits +
                middle->base.word_bits + middle->quant_bits;
            node.end =
                bitarr_read_int25(address, middle->next_mask.bits,
                                  middle->next_mask.mask);
            lm_trie_fill_raw_ngram(trie, raw_ngrams, raw_ngram_idx, counts,
                           node, hist, n_hist + 1, order, max_order);
        }
    }
    else {
        bitarr_address_t address;
        uint32 ptr;
        float prob, backoff;
        int i;
        assert(n_hist == order - 1);
        for (ptr = range.begin; ptr < range.end; ptr++) {
            ngram_raw_t *raw_ngram = &raw_ngrams[*raw_ngram_idx];
            if (order == max_order) {
                longest_t *longest = trie->longest;
                address.base = longest->base.base;
                address.offset = ptr * longest->base.total_bits;
                hist[n_hist] =
                    bitarr_read_int25(address, longest->base.word_bits,
                                      longest->base.word_mask);
                address.offset += longest->base.word_bits;
                prob = lm_trie_quant_lpread(trie->quant, address);
            }
            else {
                middle_t *middle = &trie->middle_begin[n_hist - 1];
                address.base = middle->base.base;
                address.offset = ptr * middle->base.total_bits;
                hist[n_hist] =
                    bitarr_read_int25(address, middle->base.word_bits,
                                      middle->base.word_mask);
                address.offset += middle->base.word_bits;
                prob =
                    lm_trie_quant_mpread(trie->quant, address, n_hist - 1);
                backoff =
                    lm_trie_quant_mboread(trie->quant, address,
                                          n_hist - 1);
                raw_ngram->backoff = backoff;
            }
            raw_ngram->prob = prob;
            raw_ngram->words =
                (uint32 *) ckd_calloc(order, sizeof(*raw_ngram->words));
            for (i = 0; i <= n_hist; i++) {
                raw_ngram->words[i] = hist[n_hist - i];
            }
            (*raw_ngram_idx)++;
        }
    }
}